

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O3

void pzshape::TPZShapeLinear::TransformDerivative1d(int transid,int num,TPZFMatrix<double> *in)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  if (0 < num && transid != 0) {
    lVar1 = (in->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    uVar3 = 0;
    do {
      lVar2 = (in->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
      if (lVar2 <= (long)uVar3 || lVar1 < 1) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((lVar1 < 1) || (lVar2 <= (long)uVar3)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      in->fElem[lVar1 * uVar3] = -in->fElem[lVar1 * uVar3];
      uVar3 = uVar3 + 1;
    } while ((uint)num != uVar3);
  }
  return;
}

Assistant:

void TPZShapeLinear::TransformDerivative1d(int transid,int num,TPZFMatrix<REAL> &in) {
		
		if(transid == 0) return;
		int i;
		for(i=0;i<num;i++) in(0,i) = -in(0,i);
	}